

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VSEL(DisasContext_conflict1 *s,arg_VSEL *a)

{
  int reg;
  int reg_00;
  int reg_01;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 c2;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 pTVar2;
  TCGv_i32 c2_00;
  TCGv_i32 var_01;
  TCGv_i32 var_02;
  TCGv_i32 ret_03;
  TCGv_i32 pTVar3;
  bool bVar4;
  TCGv_i32 zero_1;
  TCGv_i32 tmp_1;
  TCGv_i32 dest_1;
  TCGv_i32 frm_1;
  TCGv_i32 frn_1;
  TCGv_i64 vf;
  TCGv_i64 nf;
  TCGv_i64 zf;
  TCGv_i64 zero;
  TCGv_i64 tmp;
  TCGv_i64 dest;
  TCGv_i64 frm;
  TCGv_i64 frn;
  _Bool dp;
  uint32_t rm;
  uint32_t rn;
  uint32_t rd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VSEL *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar4 = a->dp == 0;
  _Var1 = isar_feature_aa32_vsel(s->isar);
  if (_Var1) {
    if ((bVar4) || (_Var1 = isar_feature_aa32_fpdp_v2(s->isar), _Var1)) {
      if (((bVar4) || (_Var1 = isar_feature_aa32_simd_r32(s->isar), _Var1)) ||
         (((a->vm | a->vn | a->vd) & 0x10U) == 0)) {
        reg = a->vd;
        reg_00 = a->vn;
        reg_01 = a->vm;
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          if (bVar4) {
            c2_00 = tcg_const_i32_aarch64(tcg_ctx_00,0);
            var_01 = tcg_temp_new_i32(tcg_ctx_00);
            var_02 = tcg_temp_new_i32(tcg_ctx_00);
            ret_03 = tcg_temp_new_i32(tcg_ctx_00);
            neon_load_reg32(tcg_ctx_00,var_01,reg_00);
            neon_load_reg32(tcg_ctx_00,var_02,reg_01);
            switch(a->cc) {
            case 0:
              tcg_gen_movcond_i32_aarch64
                        (tcg_ctx_00,TCG_COND_EQ,ret_03,tcg_ctx_00->cpu_ZF,c2_00,var_01,var_02);
              break;
            case 1:
              tcg_gen_movcond_i32_aarch64
                        (tcg_ctx_00,TCG_COND_LT,ret_03,tcg_ctx_00->cpu_VF,c2_00,var_01,var_02);
              break;
            case 2:
              pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_xor_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_NF);
              tcg_gen_movcond_i32_aarch64(tcg_ctx_00,TCG_COND_GE,ret_03,pTVar3,c2_00,var_01,var_02);
              tcg_temp_free_i32(tcg_ctx_00,pTVar3);
              break;
            case 3:
              tcg_gen_movcond_i32_aarch64
                        (tcg_ctx_00,TCG_COND_NE,ret_03,tcg_ctx_00->cpu_ZF,c2_00,var_01,var_02);
              pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_xor_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_VF,tcg_ctx_00->cpu_NF);
              tcg_gen_movcond_i32_aarch64(tcg_ctx_00,TCG_COND_GE,ret_03,pTVar3,c2_00,ret_03,var_02);
              tcg_temp_free_i32(tcg_ctx_00,pTVar3);
            }
            neon_store_reg32(tcg_ctx_00,ret_03,reg);
            tcg_temp_free_i32(tcg_ctx_00,var_01);
            tcg_temp_free_i32(tcg_ctx_00,var_02);
            tcg_temp_free_i32(tcg_ctx_00,ret_03);
            tcg_temp_free_i32(tcg_ctx_00,c2_00);
          }
          else {
            c2 = tcg_const_i64_aarch64(tcg_ctx_00,0);
            var = tcg_temp_new_i64(tcg_ctx_00);
            var_00 = tcg_temp_new_i64(tcg_ctx_00);
            ret = tcg_temp_new_i64(tcg_ctx_00);
            ret_00 = tcg_temp_new_i64(tcg_ctx_00);
            ret_01 = tcg_temp_new_i64(tcg_ctx_00);
            ret_02 = tcg_temp_new_i64(tcg_ctx_00);
            tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_ZF);
            tcg_gen_ext_i32_i64_aarch64(tcg_ctx_00,ret_01,tcg_ctx_00->cpu_NF);
            tcg_gen_ext_i32_i64_aarch64(tcg_ctx_00,ret_02,tcg_ctx_00->cpu_VF);
            neon_load_reg64(tcg_ctx_00,var,reg_00);
            neon_load_reg64(tcg_ctx_00,var_00,reg_01);
            switch(a->cc) {
            case 0:
              tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_EQ,ret,ret_00,c2,var,var_00);
              break;
            case 1:
              tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_LT,ret,ret_02,c2,var,var_00);
              break;
            case 2:
              pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
              tcg_gen_xor_i64_aarch64(tcg_ctx_00,pTVar2,ret_02,ret_01);
              tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_GE,ret,pTVar2,c2,var,var_00);
              tcg_temp_free_i64(tcg_ctx_00,pTVar2);
              break;
            case 3:
              tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_NE,ret,ret_00,c2,var,var_00);
              pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
              tcg_gen_xor_i64_aarch64(tcg_ctx_00,pTVar2,ret_02,ret_01);
              tcg_gen_movcond_i64_aarch64(tcg_ctx_00,TCG_COND_GE,ret,pTVar2,c2,ret,var_00);
              tcg_temp_free_i64(tcg_ctx_00,pTVar2);
            }
            neon_store_reg64(tcg_ctx_00,ret,reg);
            tcg_temp_free_i64(tcg_ctx_00,var);
            tcg_temp_free_i64(tcg_ctx_00,var_00);
            tcg_temp_free_i64(tcg_ctx_00,ret);
            tcg_temp_free_i64(tcg_ctx_00,ret_00);
            tcg_temp_free_i64(tcg_ctx_00,ret_01);
            tcg_temp_free_i64(tcg_ctx_00,ret_02);
            tcg_temp_free_i64(tcg_ctx_00,c2);
          }
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VSEL(DisasContext *s, arg_VSEL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rn, rm;
    bool dp = a->dp;

    if (!dc_isar_feature(aa32_vsel, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) &&
        ((a->vm | a->vn | a->vd) & 0x10)) {
        return false;
    }

    rd = a->vd;
    rn = a->vn;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    if (dp) {
        TCGv_i64 frn, frm, dest;
        TCGv_i64 tmp, zero, zf, nf, vf;

        zero = tcg_const_i64(tcg_ctx, 0);

        frn = tcg_temp_new_i64(tcg_ctx);
        frm = tcg_temp_new_i64(tcg_ctx);
        dest = tcg_temp_new_i64(tcg_ctx);

        zf = tcg_temp_new_i64(tcg_ctx);
        nf = tcg_temp_new_i64(tcg_ctx);
        vf = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_extu_i32_i64(tcg_ctx, zf, tcg_ctx->cpu_ZF);
        tcg_gen_ext_i32_i64(tcg_ctx, nf, tcg_ctx->cpu_NF);
        tcg_gen_ext_i32_i64(tcg_ctx, vf, tcg_ctx->cpu_VF);

        neon_load_reg64(tcg_ctx, frn, rn);
        neon_load_reg64(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, dest, zf, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, dest, vf, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, dest, zf, zero,
                                frn, frm);
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        }
        neon_store_reg64(tcg_ctx, dest, rd);
        tcg_temp_free_i64(tcg_ctx, frn);
        tcg_temp_free_i64(tcg_ctx, frm);
        tcg_temp_free_i64(tcg_ctx, dest);  // qq

        tcg_temp_free_i64(tcg_ctx, zf);
        tcg_temp_free_i64(tcg_ctx, nf);
        tcg_temp_free_i64(tcg_ctx, vf);

        tcg_temp_free_i64(tcg_ctx, zero);
    } else {
        TCGv_i32 frn, frm, dest;
        TCGv_i32 tmp, zero;

        zero = tcg_const_i32(tcg_ctx, 0);

        frn = tcg_temp_new_i32(tcg_ctx);
        frm = tcg_temp_new_i32(tcg_ctx);
        dest = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, frn, rn);
        neon_load_reg32(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, dest, tcg_ctx->cpu_VF, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        }
        neon_store_reg32(tcg_ctx, dest, rd);
        tcg_temp_free_i32(tcg_ctx, frn);
        tcg_temp_free_i32(tcg_ctx, frm);
        tcg_temp_free_i32(tcg_ctx, dest);

        tcg_temp_free_i32(tcg_ctx, zero);
    }

    return true;
}